

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::DockBuilderSetNodePos(ImGuiID node_id,ImVec2 pos)

{
  void *pvVar1;
  
  pvVar1 = ImGuiStorage::GetVoidPtr(&(GImGui->DockContext).Nodes,node_id);
  if (pvVar1 != (void *)0x0) {
    *(ImVec2 *)((long)pvVar1 + 0x40) = pos;
    *(ushort *)((long)pvVar1 + 0xb8) = ((ushort)*(undefined4 *)((long)pvVar1 + 0xb8) & 0xfff8) + 1;
  }
  return;
}

Assistant:

void ImGui::DockBuilderSetNodePos(ImGuiID node_id, ImVec2 pos)
{
    ImGuiContext* ctx = GImGui;
    ImGuiDockNode* node = DockContextFindNodeByID(ctx, node_id);
    if (node == NULL)
        return;
    node->Pos = pos;
    node->AuthorityForPos = ImGuiDataAuthority_DockNode;
}